

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_utils_leb128.c
# Opt level: O3

size_t lj_utils_read_uleb128_n(uint64_t *out,uint8_t *buffer,size_t n)

{
  ulong uVar1;
  byte *pbVar2;
  byte bVar3;
  uint64_t shift;
  uint64_t value;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  bVar3 = 0;
  uVar5 = 0;
  do {
    uVar1 = uVar5 + 1;
    if (n != 0 && n < uVar1) {
      return 0;
    }
    pbVar2 = buffer + uVar5;
    uVar4 = uVar4 | (ulong)(*pbVar2 & 0x7f) << (bVar3 & 0x3f);
    bVar3 = bVar3 + 7;
    uVar5 = uVar1;
  } while ((char)*pbVar2 < '\0');
  *out = uVar4;
  return uVar1;
}

Assistant:

size_t LJ_FASTCALL lj_utils_read_uleb128_n(uint64_t *out, const uint8_t *buffer,
					   size_t n)
{
  return _read_uleb128(out, buffer, n);
}